

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O3

void __thiscall dd::TaskQueueStdlib::ProcessTasks(TaskQueueStdlib *this)

{
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> uVar1;
  int iVar2;
  QueuedTask *release_ptr;
  NextTask local_38;
  
  Event::Set(&this->_started);
  GetNextTask(&local_38,this);
  if (local_38._final_task == false) {
    do {
      uVar1._M_t.super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
      super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl =
           (__uniq_ptr_data<dd::QueuedTask,_std::default_delete<dd::QueuedTask>,_true,_true>)
           (__uniq_ptr_data<dd::QueuedTask,_std::default_delete<dd::QueuedTask>,_true,_true>)
           local_38._run_task;
      if (local_38._run_task._M_t.
          super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
          super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
          super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>)0x0) {
        Event::Wait(&this->_flag_notify,
                    -(uint)(local_38._sleep_time_ms == 0) | (uint)local_38._sleep_time_ms,
                    -(uint)((uint)local_38._sleep_time_ms != 0xffffffff &&
                           local_38._sleep_time_ms != 0) | 3000);
      }
      else {
        iVar2 = (*(*(_func_int ***)
                    local_38._run_task._M_t.
                    super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t
                    .super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
                    super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl)[2])
                          (local_38._run_task._M_t.
                           super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>
                           .super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl);
        if ((char)iVar2 != '\0') {
          (*(*(_func_int ***)
              uVar1._M_t.super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
              ._M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
              super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl)[1])
                    (uVar1._M_t.
                     super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
                     super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl);
        }
      }
      GetNextTask(&local_38,this);
    } while (local_38._final_task == false);
  }
  if ((_Head_base<0UL,_dd::QueuedTask_*,_false>)
      local_38._run_task._M_t.
      super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
      super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl !=
      (_Head_base<0UL,_dd::QueuedTask_*,_false>)0x0) {
    (*((QueuedTask *)
      local_38._run_task._M_t.
      super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
      super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl)->_vptr_QueuedTask[1])
              (local_38._run_task._M_t.
               super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
               super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
               super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl);
  }
  DrainTasks(this);
  Event::Set(&this->_stopped);
  return;
}

Assistant:

void TaskQueueStdlib::ProcessTasks()
	{
		_started.Set();
		while (true) {
			auto task = GetNextTask();
			if (task._final_task)
				break;
			if (task._run_task) {
				QueuedTask* release_ptr = task._run_task.release();
				if (release_ptr->Run())
					delete release_ptr;
				continue;
			}

			if (0 == task._sleep_time_ms)
				_flag_notify.Wait(Event::kForever);
			else
				_flag_notify.Wait(task._sleep_time_ms);
		}
		DrainTasks();
		_stopped.Set();
	}